

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

string * __thiscall
t_netstd_generator::base_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_netstd_generator *this,t_base_type *tbase)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 auVar4 [12];
  string sStack_38;
  
  switch(tbase->base_) {
  case TYPE_VOID:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "void";
    pcVar2 = "";
    break;
  case TYPE_STRING:
    iVar1 = (*(tbase->super_t_type).super_t_doc._vptr_t_doc[7])(tbase);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((char)iVar1 == '\0') {
      pcVar3 = "string";
      pcVar2 = "";
    }
    else {
      pcVar3 = "byte[]";
      pcVar2 = "";
    }
    break;
  case TYPE_BOOL:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "bool";
    pcVar2 = "";
    break;
  case TYPE_I8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "sbyte";
    pcVar2 = "";
    break;
  case TYPE_I16:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "short";
    pcVar2 = "";
    break;
  case TYPE_I32:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "int";
    pcVar2 = "";
    break;
  case TYPE_I64:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "long";
    pcVar2 = "";
    break;
  case TYPE_DOUBLE:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "double";
    pcVar2 = "";
    break;
  default:
    auVar4 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&sStack_38,(t_base_type *)(ulong)tbase->base_,auVar4._8_4_);
    std::operator+(auVar4._0_8_,"compiler error: no C# name for base type ",&sStack_38);
    __cxa_throw(auVar4._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

string t_netstd_generator::base_type_name(t_base_type* tbase)
{
    switch (tbase->get_base())
    {
    case t_base_type::TYPE_VOID:
        return "void";
    case t_base_type::TYPE_STRING:
        if (tbase->is_binary())
        {
            return "byte[]";
        } else {
            return "string";
        }
    case t_base_type::TYPE_BOOL:
        return "bool";
    case t_base_type::TYPE_I8:
        return "sbyte";
    case t_base_type::TYPE_I16:
        return "short";
    case t_base_type::TYPE_I32:
        return "int";
    case t_base_type::TYPE_I64:
        return "long";
    case t_base_type::TYPE_DOUBLE:
        return "double";
    default:
        throw "compiler error: no C# name for base type " + t_base_type::t_base_name(tbase->get_base());
    }
}